

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTPNListBase::remove_element(CTPNListBase *this,CTcConstVal *val)

{
  CTPNListEle *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTPNListBase *pCVar3;
  CTPNListBase *pCVar4;
  CTPNListEle **ppCVar5;
  
  ppCVar5 = &this->head_;
  while (pCVar1 = *ppCVar5, pCVar1 != (CTPNListEle *)0x0) {
    iVar2 = (*(((pCVar1->super_CTPNListEleBase).expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
              [1])();
    if (CONCAT44(extraout_var,iVar2) != 0) {
      iVar2 = (*(((pCVar1->super_CTPNListEleBase).expr_)->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase
                [1])();
      iVar2 = CTcConstVal::is_equal_to((CTcConstVal *)CONCAT44(extraout_var_00,iVar2),val);
      if (iVar2 != 0) {
        pCVar3 = (CTPNListBase *)(pCVar1->super_CTPNListEleBase).next_;
        pCVar4 = (CTPNListBase *)(pCVar1->super_CTPNListEleBase).prev_;
        if (pCVar4 == (CTPNListBase *)0x0) {
          pCVar4 = this;
        }
        pCVar4->head_ = (CTPNListEle *)pCVar3;
        if (pCVar3 == (CTPNListBase *)0x0) {
          pCVar3 = this;
        }
        pCVar3->tail_ = (pCVar1->super_CTPNListEleBase).prev_;
        this->cnt_ = this->cnt_ + -1;
      }
    }
    ppCVar5 = &(pCVar1->super_CTPNListEleBase).next_;
  }
  return;
}

Assistant:

void CTPNListBase::remove_element(const CTcConstVal *val)
{
    CTPNListEle *cur;
    
    /* scan the list */
    for (cur = head_ ; cur != 0 ; cur = cur->get_next())
    {
        /* 
         *   if this element is constant, compare it to the value to be
         *   removed; if it matches, remove it 
         */
        if (cur->get_expr()->is_const()
            && cur->get_expr()->get_const_val()->is_equal_to(val))
        {
            /* set the previous element's forward pointer */
            if (cur->get_prev() == 0)
                head_ = cur->get_next();
            else
                cur->get_prev()->set_next(cur->get_next());

            /* set the next element's back pointer */
            if (cur->get_next() == 0)
                tail_ = cur->get_prev();
            else
                cur->get_next()->set_prev(cur->get_prev());

            /* decrement our element counter */
            --cnt_;
        }
    }
}